

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O1

void test_master_table_dictionary_open_close_all_1(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  Dictionary<int,_int> *pDVar2;
  
  pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
  BppTree<int,_int>::BppTree((BppTree<int,_int> *)pDVar2,1,key_type_numeric_signed,4,4);
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,0,(int)(pDVar2->dict).status,0x573,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                    );
  if (pVar1 != '\0') {
    test_master_table_dictionary_open_close(tc,pDVar2,0,dictionary_type_bpp_tree_t);
    pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
    FlatFile<int,_int>::FlatFile((FlatFile<int,_int> *)pDVar2,1,key_type_numeric_signed,4,4,0x1e);
    pVar1 = planck_unit_assert_int_are_equal
                      (tc,0,(int)(pDVar2->dict).status,0x577,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                      );
    if (pVar1 != '\0') {
      test_master_table_dictionary_open_close(tc,pDVar2,0x1e,dictionary_type_flat_file_t);
      pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
      OpenAddressHash<int,_int>::OpenAddressHash
                ((OpenAddressHash<int,_int> *)pDVar2,1,key_type_numeric_signed,4,4,0x32);
      pVar1 = planck_unit_assert_int_are_equal
                        (tc,0,(int)(pDVar2->dict).status,0x57b,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                        );
      if (pVar1 != '\0') {
        test_master_table_dictionary_open_close(tc,pDVar2,0x32,dictionary_type_open_address_hash_t);
        pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
        OpenAddressFileHash<int,_int>::OpenAddressFileHash
                  ((OpenAddressFileHash<int,_int> *)pDVar2,1,key_type_numeric_signed,4,4,0x32);
        pVar1 = planck_unit_assert_int_are_equal
                          (tc,0,(int)(pDVar2->dict).status,0x57f,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                          );
        if (pVar1 != '\0') {
          test_master_table_dictionary_open_close
                    (tc,pDVar2,0x32,dictionary_type_open_address_file_hash_t);
          pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
          SkipList<int,_int>::SkipList((SkipList<int,_int> *)pDVar2,1,key_type_numeric_signed,4,4,7)
          ;
          pVar1 = planck_unit_assert_int_are_equal
                            (tc,0,(int)(pDVar2->dict).status,0x583,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                            );
          if (pVar1 != '\0') {
            test_master_table_dictionary_open_close(tc,pDVar2,7,dictionary_type_skip_list_t);
            return;
          }
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_master_table_dictionary_open_close_all_1(
	planck_unit_test_t *tc
) {
	Dictionary<int, int> *dictionary;

	dictionary = new BppTree<int, int>(1, key_type_numeric_signed, sizeof(int), sizeof(int));
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	test_master_table_dictionary_open_close(tc, dictionary, 0, dictionary_type_bpp_tree_t);

	dictionary = new FlatFile<int, int>(1, key_type_numeric_signed, sizeof(int), sizeof(int), 30);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	test_master_table_dictionary_open_close(tc, dictionary, 30, dictionary_type_flat_file_t);

	dictionary = new OpenAddressHash<int, int>(1, key_type_numeric_signed, sizeof(int), sizeof(int), 50);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	test_master_table_dictionary_open_close(tc, dictionary, 50, dictionary_type_open_address_hash_t);

	dictionary = new OpenAddressFileHash<int, int>(1, key_type_numeric_signed, sizeof(int), sizeof(int), 50);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	test_master_table_dictionary_open_close(tc, dictionary, 50, dictionary_type_open_address_file_hash_t);

	dictionary = new SkipList<int, int>(1, key_type_numeric_signed, sizeof(int), sizeof(int), 7);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	test_master_table_dictionary_open_close(tc, dictionary, 7, dictionary_type_skip_list_t);

	/* Uncomment when LinearHash dictionary open memory issue fixed. */
/*	dictionary = new LinearHash<int, int>(1, key_type_numeric_signed, sizeof(int), sizeof(int), 7); */
/*	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status); */
/*	test_master_table_dictionary_open_close(tc, dictionary, 7, dictionary_type_linear_hash_t); */
}